

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::basic_json_parser
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,allocator<char> *temp_alloc)

{
  _Any_data local_148;
  code *local_138;
  code *local_130;
  basic_json_decode_options<wchar_t> local_120;
  
  basic_json_decode_options<wchar_t>::basic_json_decode_options(&local_120);
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_130 = std::
              _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
              ::_M_manager;
  basic_json_parser(this,&local_120,
                    (function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)
                    &local_148,temp_alloc);
  std::_Function_base::~_Function_base((_Function_base *)&local_148);
  basic_json_decode_options<wchar_t>::~basic_json_decode_options(&local_120);
  return;
}

Assistant:

basic_json_parser(const TempAllocator& temp_alloc = TempAllocator())
        : basic_json_parser(basic_json_decode_options<char_type>(), default_json_parsing(), temp_alloc)
    {
    }